

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_kv_cursor_reset(unqlite_kv_cursor *pCursor)

{
  _func_void_unqlite_kv_cursor_ptr *p_Var1;
  
  p_Var1 = pCursor->pStore->pIo->pMethods->xReset;
  if (p_Var1 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
    (*p_Var1)(pCursor);
    return 0;
  }
  return -0x11;
}

Assistant:

int unqlite_kv_cursor_reset(unqlite_kv_cursor *pCursor)
{
	int rc = UNQLITE_OK;
#ifdef UNTRUST
	if( pCursor == 0 ){
		return UNQLITE_CORRUPT;
	}
#endif
	/* Check if the requested method is implemented by the underlying storage engine */
	if( pCursor->pStore->pIo->pMethods->xReset == 0 ){
		rc = UNQLITE_NOTIMPLEMENTED;
	}else{
		/* Reset */
		pCursor->pStore->pIo->pMethods->xReset(pCursor);
	}
	return rc;
}